

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O0

string * __thiscall duckdb::BatchedDataCollection::ToString_abi_cxx11_(BatchedDataCollection *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>
  *entry;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
  *__range1;
  string *result;
  ColumnDataCollection *in_stack_00000108;
  map<unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
  *in_stack_fffffffffffffef8;
  string *__rhs;
  string local_e8 [32];
  unsigned_long in_stack_ffffffffffffff38;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  reference local_48;
  _Self local_40;
  _Self local_38;
  size_type *local_30;
  undefined1 local_11;
  
  local_11 = 0;
  __rhs = in_RDI;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::operator+=((string *)in_RDI,"Batched Data Collection\n");
  local_30 = &in_RSI[1]._M_string_length;
  local_38._M_node =
       (_Base_ptr)
       ::std::
       map<unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
       ::begin(in_stack_fffffffffffffef8);
  local_40._M_node =
       (_Base_ptr)
       ::std::
       map<unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
       ::end(in_stack_fffffffffffffef8);
  while (bVar1 = ::std::operator!=(&local_38,&local_40), bVar1) {
    local_48 = ::std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                            *)0x3add97);
    ::std::__cxx11::to_string(in_stack_ffffffffffffff38);
    ::std::operator+((char *)in_RSI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    ::std::operator+(in_RSI,(char *)__rhs);
    ::std::__cxx11::string::operator+=((string *)in_RDI,local_68);
    ::std::__cxx11::string::~string(local_68);
    ::std::__cxx11::string::~string(local_88);
    ::std::__cxx11::string::~string(local_a8);
    unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
    ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                  *)__rhs);
    ColumnDataCollection::ToString_abi_cxx11_(in_stack_00000108);
    ::std::operator+(in_RSI,(char *)__rhs);
    ::std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffff38);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    ::std::__cxx11::string::~string(local_e8);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                  *)__rhs);
  }
  return __rhs;
}

Assistant:

string BatchedDataCollection::ToString() const {
	string result;
	result += "Batched Data Collection\n";
	for (auto &entry : data) {
		result += "Batch Index - " + to_string(entry.first) + "\n";
		result += entry.second->ToString() + "\n\n";
	}
	return result;
}